

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  DataType dataType;
  TestContext *testCtx;
  char *name;
  Context *pCVar2;
  long lVar3;
  TestNode *this_00;
  long *plVar4;
  TestNode *pTVar5;
  undefined8 *puVar6;
  AttributeCase *pAVar7;
  FloatLoader *pFVar8;
  long *plVar9;
  undefined4 *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined2 uStack_6a;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  TestNode *local_40;
  long local_38;
  
  lVar3 = 0xc;
  local_40 = (TestNode *)this;
  do {
    this_00 = (TestNode *)operator_new(0x70);
    testCtx = ((TestNode *)this)->m_testCtx;
    name = *(char **)((long)&PTR_iterate_00793dd0 + lVar3 + 4);
    local_80 = &local_70;
    local_38 = lVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"test with ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_50 = *plVar9;
      lStack_48 = plVar4[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar9;
      local_60 = (long *)*plVar4;
    }
    local_58 = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,name,(char *)local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT26(uStack_6a,CONCAT15(uStack_6b,CONCAT14(uStack_6c,local_70)))
                               + 1);
    }
    cVar1 = *(char *)((long)&init::floatTargets[0].name + local_38);
    pCVar2 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    dataType = *(DataType *)(&UNK_00793ddc + local_38);
    pTVar5 = (TestNode *)operator_new(0xb0);
    local_80 = &local_70;
    uStack_6c = 0x20;
    local_70 = 0x74736554;
    local_78 = 5;
    uStack_6b = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_50 = *plVar9;
      lStack_48 = plVar4[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar9;
      local_60 = (long *)*plVar4;
    }
    local_58 = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_attrib_1f",(char *)local_60);
    pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00793e78;
    *(undefined2 *)&pTVar5[1].m_testCtx = 0x100;
    pTVar5[1].m_name._M_dataplus._M_p = "VertexAttrib1f";
    *(DataType *)&pTVar5[1].m_name._M_string_length = dataType;
    pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar5[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar5[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar5[1].m_description._M_string_length = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT26(uStack_6a,CONCAT15(uStack_6b,CONCAT14(uStack_6c,local_70)))
                               + 1);
    }
    puVar6 = (undefined8 *)operator_new(8);
    *puVar6 = &PTR__FloatLoader_00793ec8;
    *(undefined8 **)&pTVar5[1].m_name.field_2 = puVar6;
    tcu::TestNode::addChild(this_00,pTVar5);
    pTVar5 = local_40;
    pCVar2 = (Context *)local_40[1]._vptr_TestNode;
    if (cVar1 == '\0') {
      pTVar5 = (TestNode *)operator_new(0xb0);
      local_80 = &local_70;
      uStack_6c = 0x20;
      local_70 = 0x74736554;
      local_78 = 5;
      uStack_6b = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_50 = *plVar9;
        lStack_48 = plVar4[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar9;
        local_60 = (long *)*plVar4;
      }
      local_58 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_attrib_2f",(char *)local_60);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00793e78;
      *(undefined2 *)&pTVar5[1].m_testCtx = 0x100;
      pTVar5[1].m_name._M_dataplus._M_p = "VertexAttrib2f";
      *(DataType *)&pTVar5[1].m_name._M_string_length = dataType;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar5[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar5[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar5[1].m_description._M_string_length = 0;
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT26(uStack_6a,CONCAT15(uStack_6b,CONCAT14(uStack_6c,local_70))
                                         ) + 1);
      }
      puVar6 = (undefined8 *)operator_new(8);
      *puVar6 = &PTR__FloatLoader_00793f18;
      *(undefined8 **)&pTVar5[1].m_name.field_2 = puVar6;
      tcu::TestNode::addChild(this_00,pTVar5);
      pCVar2 = (Context *)local_40[1]._vptr_TestNode;
      pTVar5 = (TestNode *)operator_new(0xb0);
      local_80 = &local_70;
      uStack_6c = 0x20;
      local_70 = 0x74736554;
      local_78 = 5;
      uStack_6b = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_50 = *plVar9;
        lStack_48 = plVar4[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar9;
        local_60 = (long *)*plVar4;
      }
      local_58 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_attrib_3f",(char *)local_60);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00793e78;
      *(undefined2 *)&pTVar5[1].m_testCtx = 0x100;
      pTVar5[1].m_name._M_dataplus._M_p = "VertexAttrib3f";
      *(DataType *)&pTVar5[1].m_name._M_string_length = dataType;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar5[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar5[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar5[1].m_description._M_string_length = 0;
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT26(uStack_6a,CONCAT15(uStack_6b,CONCAT14(uStack_6c,local_70))
                                         ) + 1);
      }
      puVar6 = (undefined8 *)operator_new(8);
      *puVar6 = &PTR__FloatLoader_00793f58;
      *(undefined8 **)&pTVar5[1].m_name.field_2 = puVar6;
      tcu::TestNode::addChild(this_00,pTVar5);
      pTVar5 = local_40;
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         ((Context *)local_40[1]._vptr_TestNode,dataType);
      tcu::TestNode::addChild(this_00,(TestNode *)pAVar7);
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((Context *)pTVar5[1]._vptr_TestNode,dataType);
      tcu::TestNode::addChild(this_00,(TestNode *)pAVar7);
      pCVar2 = (Context *)pTVar5[1]._vptr_TestNode;
      pAVar7 = (AttributeCase *)operator_new(0xb0);
      local_80 = &local_70;
      uStack_6c = 0x20;
      local_70 = 0x74736554;
      local_78 = 5;
      uStack_6b = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_50 = *plVar9;
        lStack_48 = plVar4[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar9;
        local_60 = (long *)*plVar4;
      }
      local_58 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pAVar7,pCVar2->m_testCtx,"vertex_attrib_2fv",(char *)local_60);
      (pAVar7->super_TestCase).m_context = pCVar2;
      (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__AttributeCase_00793e78;
      pAVar7->m_normalizing = false;
      pAVar7->m_useNegativeValues = true;
      pAVar7->m_funcName = "VertexAttrib2fv";
      pAVar7->m_dataType = dataType;
      pAVar7->m_loader = (FloatLoader *)0x0;
      pAVar7->m_program = (ShaderProgram *)0x0;
      pAVar7->m_bufID = 0;
      pAVar7->m_allIterationsPassed = true;
      pAVar7->m_iteration = 0;
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT26(uStack_6a,CONCAT15(uStack_6b,CONCAT14(uStack_6c,local_70))
                                         ) + 1);
      }
      pFVar8 = (FloatLoader *)operator_new(8);
      pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00794018;
      pAVar7->m_loader = pFVar8;
    }
    else {
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         (pCVar2,dataType);
      tcu::TestNode::addChild(this_00,(TestNode *)pAVar7);
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((Context *)pTVar5[1]._vptr_TestNode,dataType);
    }
    tcu::TestNode::addChild(this_00,(TestNode *)pAVar7);
    if (cVar1 == '\0') {
      pCVar2 = (Context *)local_40[1]._vptr_TestNode;
      pTVar5 = (TestNode *)operator_new(0xb0);
      local_80 = &local_70;
      uStack_6c = 0x20;
      local_70 = 0x74736554;
      local_78 = 5;
      uStack_6b = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_50 = *plVar9;
        lStack_48 = plVar4[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar9;
        local_60 = (long *)*plVar4;
      }
      local_58 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_attrib_3fv",(char *)local_60);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00793e78;
      *(undefined2 *)&pTVar5[1].m_testCtx = 0x100;
      pTVar5[1].m_name._M_dataplus._M_p = "VertexAttrib3fv";
      *(DataType *)&pTVar5[1].m_name._M_string_length = dataType;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar5[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar5[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar5[1].m_description._M_string_length = 0;
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT26(uStack_6a,CONCAT15(uStack_6b,CONCAT14(uStack_6c,local_70))
                                         ) + 1);
      }
      puVar6 = (undefined8 *)operator_new(8);
      *puVar6 = &PTR__FloatLoader_00794058;
      *(undefined8 **)&pTVar5[1].m_name.field_2 = puVar6;
      tcu::TestNode::addChild(this_00,pTVar5);
    }
    pCVar2 = (Context *)local_40[1]._vptr_TestNode;
    pTVar5 = (TestNode *)operator_new(0xb0);
    local_80 = &local_70;
    uStack_6c = 0x20;
    local_70 = 0x74736554;
    local_78 = 5;
    uStack_6b = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_50 = *plVar9;
      lStack_48 = plVar4[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar9;
      local_60 = (long *)*plVar4;
    }
    local_58 = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_attrib_4fv",(char *)local_60);
    pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_00793e78;
    *(undefined2 *)&pTVar5[1].m_testCtx = 0x100;
    pTVar5[1].m_name._M_dataplus._M_p = "VertexAttrib4fv";
    *(DataType *)&pTVar5[1].m_name._M_string_length = dataType;
    pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar5[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar5[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar5[1].m_description._M_string_length = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT26(uStack_6a,CONCAT15(uStack_6b,CONCAT14(uStack_6c,local_70)))
                               + 1);
    }
    puVar6 = (undefined8 *)operator_new(8);
    *puVar6 = &PTR__FloatLoader_00794098;
    *(undefined8 **)&pTVar5[1].m_name.field_2 = puVar6;
    tcu::TestNode::addChild(this_00,pTVar5);
    this = (DefaultVertexAttributeTests *)local_40;
    tcu::TestNode::addChild(local_40,this_00);
    lVar3 = local_38 + 0x10;
  } while (lVar3 != 0x7c);
  return 0x7c;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}
}